

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qr.c
# Opt level: O0

void qrPower(word *c,word *a,word *b,size_t m,qr_o *r,void *stack)

{
  bool_t bVar1;
  size_t sVar2;
  ulong uVar3;
  word *b_00;
  word *pwVar4;
  size_t sVar5;
  size_t in_RCX;
  word *in_RDX;
  word *in_RSI;
  word *in_RDI;
  long in_R8;
  word *in_R9;
  size_t i;
  word *powers;
  word *power;
  size_t pos;
  size_t slide_size;
  word slide;
  size_t powers_count;
  size_t w;
  size_t in_stack_ffffffffffffff78;
  word *in_stack_ffffffffffffff80;
  size_t local_78;
  ulong local_70;
  size_t local_58;
  size_t local_50;
  ulong local_48;
  
  sVar2 = qrCalcSlideWidth(in_RCX);
  uVar3 = 1L << ((char)sVar2 - 1U & 0x3f);
  b_00 = in_R9 + *(long *)(in_R8 + 0x30);
  pwVar4 = b_00 + *(long *)(in_R8 + 0x30) * uVar3;
  bVar1 = wwIsZero(in_RDX,in_RCX);
  if (bVar1 == 0) {
    if (sVar2 == 1) {
      wwCopy(b_00,in_RSI,*(size_t *)(in_R8 + 0x30));
    }
    else {
      (**(code **)(in_R8 + 0x70))(b_00,in_RSI,in_R8,pwVar4);
      (**(code **)(in_R8 + 0x68))(b_00 + *(long *)(in_R8 + 0x30),in_RSI,b_00,in_R8,pwVar4);
      for (local_70 = 2; local_70 < uVar3; local_70 = local_70 + 1) {
        (**(code **)(in_R8 + 0x68))
                  (b_00 + *(long *)(in_R8 + 0x30) * local_70,
                   b_00 + (*(long *)(in_R8 + 0x30) * local_70 - *(long *)(in_R8 + 0x30)),b_00,in_R8,
                   pwVar4);
      }
      wwCopy(b_00,in_RSI,*(size_t *)(in_R8 + 0x30));
    }
    sVar5 = wwBitSize(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    local_78 = sVar2;
    if (sVar5 < sVar2) {
      local_78 = sVar5;
    }
    local_50 = local_78;
    for (local_48 = wwGetBits(in_RDX,((sVar5 - 1) - local_78) + 1,local_78); (local_48 & 1) == 0;
        local_48 = local_48 >> 1) {
      local_50 = local_50 - 1;
    }
    wwCopy(in_R9,b_00 + *(long *)(in_R8 + 0x30) * (local_48 >> 1),*(size_t *)(in_R8 + 0x30));
    local_58 = (sVar5 - 1) - local_50;
    while (local_58 != 0xffffffffffffffff) {
      bVar1 = wwTestBit(in_RDX,local_58);
      if (bVar1 == 0) {
        (**(code **)(in_R8 + 0x70))(in_R9,in_R9,in_R8,pwVar4);
        local_58 = local_58 - 1;
      }
      else {
        local_50 = sVar2;
        if (local_58 + 1 < sVar2) {
          local_50 = local_58 + 1;
        }
        for (local_48 = wwGetBits(in_RDX,(local_58 - local_50) + 1,local_50); (local_48 & 1) == 0;
            local_48 = local_48 >> 1) {
          local_50 = local_50 - 1;
        }
        local_58 = local_58 - local_50;
        while (local_50 != 0) {
          (**(code **)(in_R8 + 0x70))(in_R9,in_R9,in_R8,pwVar4);
          local_50 = local_50 - 1;
        }
        (**(code **)(in_R8 + 0x68))
                  (in_R9,in_R9,b_00 + *(long *)(in_R8 + 0x30) * (local_48 >> 1),in_R8,pwVar4);
      }
    }
    wwCopy(in_RDI,in_R9,*(size_t *)(in_R8 + 0x30));
  }
  else {
    wwCopy(in_RDI,*(word **)(in_R8 + 0x20),*(size_t *)(in_R8 + 0x30));
  }
  return;
}

Assistant:

void qrPower(word c[], const word a[], const word b[], size_t m, 
	const qr_o* r, void* stack)
{
	const size_t w = qrCalcSlideWidth(m);
	const size_t powers_count = SIZE_1 << (w - 1);
	register word slide;
	register size_t slide_size;
	size_t pos;
	// переменные в stack
	word* power;
	word* powers;
	// pre
	ASSERT(qrIsOperable(r));
	ASSERT(wwIsValid(a, r->n));
	ASSERT(wwIsValid(b, m));
	ASSERT(wwIsValid(c, r->n));
	// раскладка stack
	power = (word*)stack;
	powers = power + r->n;
	stack = powers + r->n * powers_count;
	// b == 0? => с <- unity
	if (wwIsZero(b, m))
	{
		wwCopy(c, r->unity, r->n);
		return;
	}
	// расчет малых степеней a
	ASSERT(w > 0);
	if (w == 1)
		wwCopy(powers, a, r->n);
	else
	{
		size_t i;
		// powers[0] <- a^2
		qrSqr(powers, a, r, stack);
		// powers[1] <- a^3
		qrMul(powers + r->n, a, powers, r, stack);
		// powers[i] <- a^{2i + 1} = powers[i - 1] * powers[0]
		for (i = 2; i < powers_count; ++i)
			qrMul(powers + r->n * i, powers + r->n * i - r->n, powers, r, 
				stack);
		// powers[0] <- a
		wwCopy(powers, a, r->n);
	}
	// pos <- l - 1
	pos = wwBitSize(b, m) - 1;
	ASSERT(pos != SIZE_MAX);
	// slide <- старший слайд b
	slide_size = MIN2(pos + 1, w);
	slide = wwGetBits(b, pos - slide_size + 1, slide_size);
	while (slide % 2 == 0)
		slide >>= 1, slide_size--;
	// power <- powers[slide / 2]
	wwCopy(power, powers + r->n * (slide / 2), r->n);
	pos -= slide_size;
	// пробегаем биты b
	while (pos != SIZE_MAX)
		if (!wwTestBit(b, pos))
		{
			// power <- power^2
			qrSqr(power, power, r, stack);
			--pos;
		}
		else
		{
			// slide <- очередной слайд b
			slide_size = MIN2(pos + 1, w);
			slide = wwGetBits(b, pos - slide_size + 1, slide_size);
			while (slide % 2 == 0)
				slide >>= 1, slide_size--;
			pos -= slide_size;
			// power <- power^2
			while (slide_size--)
				qrSqr(power, power, r, stack);
			// power <- power * powers[slide / 2]
			qrMul(power, power, powers + r->n * (slide / 2), r, stack);
		}
	// очистка и возврат
	slide_size = 0, slide = 0;
	wwCopy(c, power, r->n);
}